

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorProto::MergeFrom
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  uint uVar1;
  LogMessage *other;
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  FileOptions *from_00;
  SourceCodeInfo *from_01;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x605);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             &(from->dependency_).super_RepeatedPtrFieldBase);
  RepeatedField<int>::MergeFrom(&this->public_dependency_,&from->public_dependency_);
  RepeatedField<int>::MergeFrom(&this->weak_dependency_,&from->weak_dependency_);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             &(from->message_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(from->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
            (&(this->service_).super_RepeatedPtrFieldBase,
             &(from->service_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(from->extension_).super_RepeatedPtrFieldBase);
  uVar1 = from->_has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      set_name(this,from->name_);
      uVar1 = from->_has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      set_package(this,from->package_);
      uVar1 = from->_has_bits_[0];
    }
  }
  if ((uVar1 & 0x1fe00) != 0) {
    if ((uVar1 >> 9 & 1) != 0) {
      this_00 = mutable_options(this);
      from_00 = from->options_;
      if (from_00 == (FileOptions *)0x0) {
        from_00 = *(FileOptions **)(default_instance_ + 0xb8);
      }
      FileOptions::MergeFrom(this_00,from_00);
      uVar1 = from->_has_bits_[0];
    }
    if ((uVar1 >> 10 & 1) != 0) {
      this_01 = mutable_source_code_info(this);
      from_01 = from->source_code_info_;
      if (from_01 == (SourceCodeInfo *)0x0) {
        from_01 = *(SourceCodeInfo **)(default_instance_ + 0xc0);
      }
      SourceCodeInfo::MergeFrom(this_01,from_01);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void FileDescriptorProto::MergeFrom(const FileDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  dependency_.MergeFrom(from.dependency_);
  public_dependency_.MergeFrom(from.public_dependency_);
  weak_dependency_.MergeFrom(from.weak_dependency_);
  message_type_.MergeFrom(from.message_type_);
  enum_type_.MergeFrom(from.enum_type_);
  service_.MergeFrom(from.service_);
  extension_.MergeFrom(from.extension_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_package()) {
      set_package(from.package());
    }
  }
  if (from._has_bits_[9 / 32] & (0xffu << (9 % 32))) {
    if (from.has_options()) {
      mutable_options()->::google::protobuf::FileOptions::MergeFrom(from.options());
    }
    if (from.has_source_code_info()) {
      mutable_source_code_info()->::google::protobuf::SourceCodeInfo::MergeFrom(from.source_code_info());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}